

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dac.c
# Opt level: O0

void adc_dsp(t_adc *x,t_signal **sp)

{
  int iVar1;
  int iVar2;
  t_signal **pptStack_30;
  int ch;
  t_signal **sp2;
  t_int *ip;
  t_int i;
  t_signal **sp_local;
  t_adc *x_local;
  
  sp2 = (t_signal **)x->x_vec;
  pptStack_30 = sp;
  ip = (t_int *)x->x_n;
  while (ip != (t_int *)0x0) {
    iVar1 = (int)*sp2 + -1;
    if ((*pptStack_30)->s_n == 0x40) {
      if ((iVar1 < 0) || (iVar2 = sys_get_inchannels(), iVar2 <= iVar1)) {
        dsp_add_zero((*pptStack_30)->s_vec,0x40);
      }
      else {
        dsp_add_copy((pd_maininstance.pd_stuff)->st_soundin + iVar1 * 0x40,(*pptStack_30)->s_vec,
                     0x40);
      }
    }
    else {
      pd_error((void *)0x0,"adc~: bad vector size");
    }
    sp2 = sp2 + 1;
    pptStack_30 = pptStack_30 + 1;
    ip = (t_int *)((long)ip + -1);
  }
  return;
}

Assistant:

static void adc_dsp(t_adc *x, t_signal **sp)
{
    t_int i, *ip;
    t_signal **sp2;
    for (i = x->x_n, ip = x->x_vec, sp2 = sp; i--; ip++, sp2++)
    {
        int ch = (int)(*ip - 1);
        if ((*sp2)->s_n != DEFDACBLKSIZE)
            pd_error(0, "adc~: bad vector size");
        else if (ch >= 0 && ch < sys_get_inchannels())
            dsp_add_copy(STUFF->st_soundin + DEFDACBLKSIZE*ch,
                (*sp2)->s_vec, DEFDACBLKSIZE);
        else dsp_add_zero((*sp2)->s_vec, DEFDACBLKSIZE);
    }
}